

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::peer_list::apply_port_filter
          (peer_list *this,port_filter *filter,torrent_state *state,
          vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
          *banned)

{
  peer_connection_interface *ppVar1;
  _Map_pointer this_00;
  bool bVar2;
  uint uVar3;
  int iVar4;
  reference pptVar5;
  difference_type dVar6;
  size_type sVar7;
  undefined4 extraout_var;
  int __type;
  iterator local_158;
  _Self local_138;
  _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
  local_118;
  iterator local_f8;
  _Self local_d8;
  undefined1 local_b1;
  error_code local_b0;
  peer_connection_interface *local_a0;
  peer_connection_interface *p;
  undefined1 local_90 [4];
  int count;
  int local_6c;
  undefined1 local_68 [4];
  int current;
  undefined1 local_48 [8];
  iterator i;
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
  *banned_local;
  torrent_state *state_local;
  port_filter *filter_local;
  peer_list *this_local;
  
  i._M_node = (_Map_pointer)banned;
  ::std::deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
  begin((iterator *)local_48,
        (deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_> *)
        this);
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          ::std::
          deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
          end((iterator *)local_68,
              (deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               *)this);
          bVar2 = ::std::operator!=((_Self *)local_48,(_Self *)local_68);
          if (!bVar2) {
            return;
          }
          pptVar5 = ::std::
                    _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                    ::operator*((_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                                 *)local_48);
          uVar3 = port_filter::access(filter,(char *)(ulong)(*pptVar5)->port,__type);
          if ((uVar3 & 1) != 0) break;
          ::std::
          _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
          ::operator++((_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                        *)local_48);
        }
        pptVar5 = ::std::
                  _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                  ::operator*((_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                               *)local_48);
        if (*pptVar5 != this->m_locked_peer) break;
        ::std::
        _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
        ::operator++((_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                      *)local_48);
      }
      ::std::
      deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
      begin((iterator *)local_90,
            (deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             *)this);
      dVar6 = ::std::operator-((_Self *)local_48,(_Self *)local_90);
      local_6c = (int)dVar6;
      pptVar5 = ::std::
                _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                ::operator*((_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                             *)local_48);
      if ((*pptVar5)->connection != (peer_connection_interface *)0x0) break;
LAB_004f88e0:
      ::std::
      _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
      ::_Deque_iterator(&local_118,
                        (_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                         *)local_48);
      erase_peer(this,&local_118,state);
      ::std::
      deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
      begin(&local_158,
            (deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             *)this);
      ::std::operator+(&local_138,&local_158,(long)local_6c);
      local_48 = (undefined1  [8])local_138._M_cur;
      i._M_cur = local_138._M_first;
      i._M_first = local_138._M_last;
      i._M_last = (_Elt_pointer)local_138._M_node;
    }
    sVar7 = ::std::
            deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
            ::size((deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    *)this);
    p._4_4_ = (int)sVar7;
    pptVar5 = ::std::
              _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
              ::operator*((_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                           *)local_48);
    this_00 = i._M_node;
    local_a0 = (*pptVar5)->connection;
    iVar4 = (*local_a0->_vptr_peer_connection_interface[2])();
    ::std::
    vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
    ::push_back((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                 *)this_00,(value_type *)CONCAT44(extraout_var,iVar4));
    ppVar1 = local_a0;
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              (&local_b0,banned_by_port_filter,(type *)0x0);
    local_b1 = 0;
    (*ppVar1->_vptr_peer_connection_interface[4])(ppVar1,&local_b0,1,0);
    sVar7 = ::std::
            deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
            ::size((deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    *)this);
    if (p._4_4_ <= (int)sVar7) goto LAB_004f88e0;
    ::std::deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
    ::begin(&local_f8,
            (deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             *)this);
    ::std::operator+(&local_d8,&local_f8,(long)local_6c);
    local_48 = (undefined1  [8])local_d8._M_cur;
    i._M_cur = local_d8._M_first;
    i._M_first = local_d8._M_last;
    i._M_last = (_Elt_pointer)local_d8._M_node;
  } while( true );
}

Assistant:

void peer_list::apply_port_filter(port_filter const& filter
		, torrent_state* state, std::vector<tcp::endpoint>& banned)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		for (auto i = m_peers.begin(); i != m_peers.end();)
		{
			if ((filter.access((*i)->port) & port_filter::blocked) == 0)
			{
				++i;
				continue;
			}
			if (*i == m_locked_peer)
			{
				++i;
				continue;
			}

			int const current = int(i - m_peers.begin());
			TORRENT_ASSERT(current >= 0);
			TORRENT_ASSERT(m_peers.size() > 0);
			TORRENT_ASSERT(i != m_peers.end());

			if ((*i)->connection)
			{
				// disconnecting the peer here may also delete the
				// peer_info_struct. If that is the case, just continue
				int count = int(m_peers.size());
				peer_connection_interface* p = (*i)->connection;

				banned.push_back(p->remote());

				p->disconnect(errors::banned_by_port_filter, operation_t::bittorrent);
				// what *i refers to has changed, i.e. cur was deleted
				if (int(m_peers.size()) < count)
				{
					i = m_peers.begin() + current;
					continue;
				}
				TORRENT_ASSERT((*i)->connection == nullptr
					|| (*i)->connection->peer_info_struct() == nullptr);
			}

			erase_peer(i, state);
			i = m_peers.begin() + current;
		}
	}